

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

uint32_t __thiscall leveldb::Random::Next(Random *this)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  
  uVar4 = (ulong)this->seed_ * 0x41a7;
  uVar3 = (uint)uVar4 & 0x7fffffff;
  iVar1 = (int)(uVar4 >> 0x1f);
  uVar5 = iVar1 + uVar3;
  uVar2 = iVar1 + uVar3 + 0x80000001;
  if (-1 < (int)uVar5) {
    uVar2 = uVar5;
  }
  this->seed_ = uVar2;
  return uVar2;
}

Assistant:

uint32_t Next() {
    static const uint32_t M = 2147483647L;  // 2^31-1
    static const uint64_t A = 16807;        // bits 14, 8, 7, 5, 2, 1, 0
    // We are computing
    //       seed_ = (seed_ * A) % M,    where M = 2^31-1
    //
    // seed_ must not be zero or M, or else all subsequent computed values
    // will be zero or M respectively.  For all other values, seed_ will end
    // up cycling through every number in [1,M-1]
    uint64_t product = seed_ * A;

    // Compute (product % M) using the fact that ((x << 31) % M) == x.
    seed_ = static_cast<uint32_t>((product >> 31) + (product & M));
    // The first reduction may overflow by 1 bit, so we may need to
    // repeat.  mod == M is not possible; using > allows the faster
    // sign-bit-based test.
    if (seed_ > M) {
      seed_ -= M;
    }
    return seed_;
  }